

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbs.cc
# Opt level: O0

int CBS_is_valid_asn1_integer(CBS *cbs,int *out_is_negative)

{
  int iVar1;
  byte local_32;
  byte local_31;
  undefined1 auStack_30 [6];
  uint8_t second_byte;
  uint8_t first_byte;
  CBS copy;
  int *out_is_negative_local;
  CBS *cbs_local;
  
  _auStack_30 = cbs->data;
  copy.data = (uint8_t *)cbs->len;
  copy.len = (size_t)out_is_negative;
  iVar1 = CBS_get_u8((CBS *)auStack_30,&local_31);
  if (iVar1 == 0) {
    cbs_local._4_4_ = 0;
  }
  else {
    if (copy.len != 0) {
      *(uint *)copy.len = (uint)((local_31 & 0x80) != 0);
    }
    iVar1 = CBS_get_u8((CBS *)auStack_30,&local_32);
    if (iVar1 == 0) {
      cbs_local._4_4_ = 1;
    }
    else if (((local_31 == 0) && ((local_32 & 0x80) == 0)) ||
            ((local_31 == 0xff && ((local_32 & 0x80) != 0)))) {
      cbs_local._4_4_ = 0;
    }
    else {
      cbs_local._4_4_ = 1;
    }
  }
  return cbs_local._4_4_;
}

Assistant:

int CBS_is_valid_asn1_integer(const CBS *cbs, int *out_is_negative) {
  CBS copy = *cbs;
  uint8_t first_byte, second_byte;
  if (!CBS_get_u8(&copy, &first_byte)) {
    return 0;  // INTEGERs may not be empty.
  }
  if (out_is_negative != NULL) {
    *out_is_negative = (first_byte & 0x80) != 0;
  }
  if (!CBS_get_u8(&copy, &second_byte)) {
    return 1;  // One byte INTEGERs are always minimal.
  }
  if ((first_byte == 0x00 && (second_byte & 0x80) == 0) ||
      (first_byte == 0xff && (second_byte & 0x80) != 0)) {
    return 0;  // The value is minimal iff the first 9 bits are not all equal.
  }
  return 1;
}